

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.h
# Opt level: O2

unique_ptr<cmCommand,_std::default_delete<cmCommand>_> __thiscall
cmCTestStartCommand::Clone(cmCTestStartCommand *this)

{
  _func_int *p_Var1;
  long in_RSI;
  _func_int **local_20;
  
  std::make_unique<cmCTestStartCommand>();
  p_Var1 = *(_func_int **)(in_RSI + 0x20);
  local_20[3] = *(_func_int **)(in_RSI + 0x18);
  local_20[4] = p_Var1;
  *(undefined1 *)(local_20 + 5) = *(undefined1 *)(in_RSI + 0x28);
  *(undefined1 *)((long)local_20 + 0x29) = *(undefined1 *)(in_RSI + 0x29);
  (this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand = local_20;
  return (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
         (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCommand> Clone() override
  {
    auto ni = cm::make_unique<cmCTestStartCommand>();
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    ni->CreateNewTag = this->CreateNewTag;
    ni->Quiet = this->Quiet;
    return std::unique_ptr<cmCommand>(std::move(ni));
  }